

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

void __thiscall google::protobuf::io::CodedInputStream::PopLimit(CodedInputStream *this,Limit limit)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  
  this->current_limit_ = limit;
  iVar1 = this->buffer_size_after_limit_;
  puVar2 = this->buffer_end_;
  this->buffer_end_ = puVar2 + iVar1;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar3 = this->total_bytes_read_ - limit;
  if (iVar3 == 0 || this->total_bytes_read_ < limit) {
    this->buffer_size_after_limit_ = 0;
  }
  else {
    this->buffer_size_after_limit_ = iVar3;
    this->buffer_end_ = puVar2 + iVar1 + -(long)iVar3;
  }
  this->legitimate_message_end_ = false;
  return;
}

Assistant:

void CodedInputStream::PopLimit(Limit limit) {
  // The limit passed in is actually the *old* limit, which we returned from
  // PushLimit().
  current_limit_ = limit;
  RecomputeBufferLimits();

  // We may no longer be at a legitimate message end.  ReadTag() needs to be
  // called again to find out.
  legitimate_message_end_ = false;
}